

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

int __thiscall ON_wString::ReverseFind(ON_wString *this,wchar_t *s)

{
  wchar_t *pwVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  bool bVar5;
  bool bVar6;
  ON_Internal_Empty_wString *pOVar7;
  int element_count1;
  ulong uVar8;
  ulong unaff_R15;
  
  uVar8 = 0;
  if (s != (wchar_t *)0x0) {
    do {
      if (s[uVar8] == L'\0') goto LAB_00681a49;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x7ffffffd);
    uVar8 = 0x7ffffffd;
  }
LAB_00681a49:
  pwVar4 = this->m_s;
  pOVar7 = &empty_wstring;
  if (pwVar4 != (wchar_t *)0x0) {
    pOVar7 = (ON_Internal_Empty_wString *)(pwVar4 + -3);
  }
  element_count1 = (int)uVar8;
  if (0 < element_count1) {
    iVar2 = (pOVar7->header).string_length;
    if (element_count1 <= iVar2) {
      bVar5 = pwVar4 < pwVar4 + (long)(iVar2 - element_count1) + 1;
      if (pwVar4 < pwVar4 + (long)(iVar2 - element_count1) + 1) {
        wVar3 = *s;
        unaff_R15 = (long)iVar2 * 4 + (uVar8 & 0xffffffff) * -4;
        do {
          if ((wVar3 == *(wchar_t *)((long)pwVar4 + unaff_R15)) &&
             (bVar6 = EqualOrdinal((wchar_t *)((long)pwVar4 + unaff_R15),element_count1,s,
                                   element_count1,false), bVar6)) {
            unaff_R15 = unaff_R15 >> 2;
            break;
          }
          pwVar1 = (wchar_t *)((long)pwVar4 + unaff_R15);
          unaff_R15 = unaff_R15 - 4;
          bVar5 = pwVar4 < pwVar1;
        } while (pwVar4 < pwVar1);
      }
      if (bVar5) {
        return (int)unaff_R15;
      }
    }
  }
  return -1;
}

Assistant:

int ON_wString::ReverseFind(const wchar_t* s) const
{
  const int s_len = ON_wString::Length(s);
  const int this_len = Length();
  if (s_len > 0 && s_len <= this_len )
  {
    const wchar_t* p0 = m_s;
    const wchar_t* p = p0 + (this_len - s_len + 1);
    const wchar_t w0 = s[0];
    while (p > p0)
    {
      p--;
      if ( w0 == p[0] && ON_wString::EqualOrdinal(p,s_len,s,s_len,false) )
        return ((int)(p - p0));
    }
  }
  return -1;
}